

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divider_tests.cpp
# Opt level: O0

void __thiscall
DividerTest_DivisionByZero_Test::DividerTest_DivisionByZero_Test
          (DividerTest_DivisionByZero_Test *this)

{
  undefined8 *in_RDI;
  DividerTest *in_stack_00000130;
  
  DividerTest::DividerTest(in_stack_00000130);
  *in_RDI = &PTR__DividerTest_DivisionByZero_Test_001abee0;
  return;
}

Assistant:

TEST_F(DividerTest, DivisionByZero) {
  Division d = Division(Fraction{1, 0});
  try {
    d.divide();
    FAIL() << "Expected divide() method to throw DivisionByZeroException";
  } catch (DivisionByZero const &err) {
    EXPECT_EQ(err.what(), DIVISION_BY_ZERO_MESSAGE);
  }
  catch (...) {
    FAIL() << "Expected DivisionByZeroException!";
  }
}